

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O3

void libtorrent::rc4_init(uchar *in,size_t len,rc4 *state)

{
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  array<std::uint8_t,_key_size> key;
  char local_110 [256];
  
  state->x = 0;
  if (len == 0) {
    iVar6 = 0;
  }
  else {
    sVar2 = 0x100;
    if (len < 0x100) {
      sVar2 = len;
    }
    sVar4 = 0;
    do {
      uVar9 = in[sVar4];
      iVar6 = state->x;
      state->x = iVar6 + 1;
      (state->buf).super_array<unsigned_char,_256UL>._M_elems[iVar6] = uVar9;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    iVar6 = state->x;
  }
  memcpy(local_110,&state->buf,0x100);
  uVar9 = '\0';
  uVar10 = '\x01';
  uVar11 = '\x02';
  uVar12 = '\x03';
  uVar13 = '\x04';
  uVar14 = '\x05';
  uVar15 = '\x06';
  uVar16 = '\a';
  uVar17 = '\b';
  uVar18 = '\t';
  uVar19 = '\n';
  uVar20 = '\v';
  uVar21 = '\f';
  uVar22 = '\r';
  uVar23 = '\x0e';
  uVar24 = '\x0f';
  lVar3 = 8;
  do {
    puVar1 = (state->buf).super_array<unsigned_char,_256UL>._M_elems + lVar3 + -8;
    *puVar1 = uVar9;
    puVar1[1] = uVar10;
    puVar1[2] = uVar11;
    puVar1[3] = uVar12;
    puVar1[4] = uVar13;
    puVar1[5] = uVar14;
    puVar1[6] = uVar15;
    puVar1[7] = uVar16;
    puVar1[8] = uVar17;
    puVar1[9] = uVar18;
    puVar1[10] = uVar19;
    puVar1[0xb] = uVar20;
    puVar1[0xc] = uVar21;
    puVar1[0xd] = uVar22;
    puVar1[0xe] = uVar23;
    puVar1[0xf] = uVar24;
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
    uVar21 = uVar21 + '\x10';
    uVar22 = uVar22 + '\x10';
    uVar23 = uVar23 + '\x10';
    uVar24 = uVar24 + '\x10';
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x108);
  lVar3 = 8;
  iVar5 = 0;
  bVar7 = 0;
  do {
    uVar9 = (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar3 + -8];
    lVar8 = (long)iVar5;
    iVar5 = iVar5 + 1;
    bVar7 = bVar7 + uVar9 + local_110[lVar8];
    if (iVar5 == iVar6) {
      iVar5 = 0;
    }
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar3 + -8] =
         (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar7];
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar7] = uVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x108);
  state->x = 0;
  state->y = 0;
  return;
}

Assistant:

void rc4_init(const unsigned char* in, std::size_t len, rc4 *state)
{
	std::size_t const key_size = sizeof(state->buf);
	aux::array<std::uint8_t, key_size> key;
	std::uint8_t tmp, *s;
	int keylen, x, y, j;

	TORRENT_ASSERT(state != nullptr);
	TORRENT_ASSERT(len <= key_size);
	if (len > key_size) len = key_size;

	state->x = 0;
	while (len--) {
		state->buf[state->x++] = *in++;
	}

	/* extract the key */
	s = state->buf.data();
	std::memcpy(key.data(), s, key_size);
	keylen = state->x;

	/* make RC4 perm and shuffle */
	for (x = 0; x < int(key_size); ++x) {
		s[x] = x & 0xff;
	}

	for (j = x = y = 0; x < int(key_size); x++) {
		y = (y + state->buf[x] + key[j++]) & 255;
		if (j == keylen) {
			j = 0;
		}
		tmp = s[x]; s[x] = s[y]; s[y] = tmp;
	}
	state->x = 0;
	state->y = 0;
}